

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Parser * psr_new(Parser *__return_storage_ptr__,VM *vm,int pkg,char *path,char *code)

{
  Local *pLVar1;
  Parser *psr;
  Lexer local_60;
  char *local_28;
  char *code_local;
  char *path_local;
  VM *pVStack_10;
  int pkg_local;
  VM *vm_local;
  
  __return_storage_ptr__->vm = vm;
  local_28 = code;
  code_local = path;
  path_local._4_4_ = pkg;
  pVStack_10 = vm;
  lex_new(&local_60,vm,path,code);
  memcpy(&__return_storage_ptr__->lxr,&local_60,0x38);
  __return_storage_ptr__->pkg = path_local._4_4_;
  __return_storage_ptr__->scope = (FnScope *)0x0;
  __return_storage_ptr__->locals_capacity = 0x10;
  __return_storage_ptr__->locals_count = 0;
  pLVar1 = (Local *)malloc((long)__return_storage_ptr__->locals_capacity << 3);
  __return_storage_ptr__->locals = pLVar1;
  return __return_storage_ptr__;
}

Assistant:

static Parser psr_new(VM *vm, int pkg, char *path, char *code) {
	Parser psr;
	psr.vm = vm;
	psr.lxr = lex_new(vm, path, code);
	psr.pkg = pkg;
	psr.scope = NULL;
	psr.locals_capacity = 16;
	psr.locals_count = 0;
	psr.locals = malloc(sizeof(Local) * psr.locals_capacity);
	return psr;
}